

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

size_t sysbvm_tuple_hash(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  ulong uVar1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t sVar5;
  sysbvm_object_tuple_t *object;
  sysbvm_tuple_t local_28;
  
  uVar1 = tuple & 0xf;
  psVar2 = (sysbvm_tuple_t *)tuple;
  if (uVar1 != 0 || tuple == 0) {
    if ((int)uVar1 == 0xf) {
      if (0x5f < tuple) {
        sVar3 = 0;
        goto LAB_001396ec;
      }
      psVar2 = (context->roots).immediateTrivialTypeTable + (tuple >> 4);
    }
    else {
      psVar2 = (context->roots).immediateTypeTable + uVar1;
    }
  }
  sVar3 = *psVar2;
LAB_001396ec:
  if (sVar3 != 0) {
    sVar3 = sysbvm_type_getHashFunction(context,sVar3);
    if (sVar3 == 0) {
      sVar5 = 0;
    }
    else {
      local_28 = tuple;
      sVar4 = sysbvm_function_apply(context,sVar3,1,&local_28,0);
      if (sVar4 == 0 || (sVar4 & 0xf) != 0) {
        sVar5 = (long)sVar4 >> 4;
      }
      else {
        sVar5 = *(size_t *)(sVar4 + 0x10);
      }
    }
    if (sVar3 != 0) {
      return sVar5;
    }
  }
  if (uVar1 != 0 || tuple == 0) {
    sVar5 = tuple * 0x41c64e6d & 0x7ffffffffffffff;
  }
  else {
    sVar5 = (size_t)(*(uint *)(tuple + 8) >> 10);
  }
  return sVar5;
}

Assistant:

SYSBVM_API size_t sysbvm_tuple_hash(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type)
    {
        sysbvm_tuple_t hashFunction = sysbvm_type_getHashFunction(context, type);
        if(hashFunction)
            return sysbvm_tuple_size_decode(sysbvm_function_apply1(context, hashFunction, tuple));
    }

    return sysbvm_tuple_identityHash(tuple);
}